

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_test.pb.cc
# Opt level: O2

void __thiscall proto2_unittest::TestAny::Clear(TestAny *this)

{
  Any *this_00;
  anon_union_56_1_493b367e_for_TestAny_3 aVar1;
  LogMessageFatal local_20;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Any>>
            (&(this->field_0)._impl_.repeated_any_value_.super_RepeatedPtrFieldBase);
  aVar1 = this->field_0;
  if (((undefined1  [56])aVar1 & (undefined1  [56])0x3) != (undefined1  [56])0x0) {
    if (((undefined1  [56])aVar1 & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.text_);
    }
    if (((undefined1  [56])aVar1 & (undefined1  [56])0x2) != (undefined1  [56])0x0) {
      this_00 = (this->field_0)._impl_.any_value_;
      if (this_00 == (Any *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/any_test.pb.cc"
                   ,0x14a,"_impl_.any_value_ != nullptr");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      google::protobuf::Any::Clear(this_00);
    }
  }
  (this->field_0)._impl_.int32_value_ = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestAny::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestAny)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_any_value_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.text_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.any_value_ != nullptr);
      _impl_.any_value_->Clear();
    }
  }
  _impl_.int32_value_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}